

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTypes.h
# Opt level: O0

void __thiscall cmNinjaRule::~cmNinjaRule(cmNinjaRule *this)

{
  cmNinjaRule *this_local;
  
  std::__cxx11::string::~string((string *)&this->Restat);
  std::__cxx11::string::~string((string *)&this->RspContent);
  std::__cxx11::string::~string((string *)&this->RspFile);
  std::__cxx11::string::~string((string *)&this->DepType);
  std::__cxx11::string::~string((string *)&this->DepFile);
  std::__cxx11::string::~string((string *)&this->Comment);
  std::__cxx11::string::~string((string *)&this->Description);
  std::__cxx11::string::~string((string *)&this->Command);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmNinjaRule(std::string name)
    : Name(std::move(name))
  {
  }